

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O1

RealType __thiscall OpenMD::Snapshot::getLongRangePotential(Snapshot *this)

{
  int i;
  long lVar1;
  double dVar2;
  
  if (this->hasLongRangePotential == false) {
    (this->frameData).longRangePotential = 0.0;
    dVar2 = 0.0;
    lVar1 = 0;
    do {
      dVar2 = dVar2 + (this->frameData).lrPotentials.data_[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 7);
    (this->frameData).longRangePotential =
         dVar2 + (this->frameData).reciprocalPotential + (this->frameData).surfacePotential;
    this->hasLongRangePotential = true;
    this->hasPotentialEnergy = false;
    this->hasTotalEnergy = false;
  }
  return (this->frameData).longRangePotential;
}

Assistant:

RealType Snapshot::getLongRangePotential() {
    if (!hasLongRangePotential) {
      frameData.longRangePotential = 0.0;
      for (int i = 0; i < N_INTERACTION_FAMILIES; i++) {
        frameData.longRangePotential += frameData.lrPotentials[i];
      }
      frameData.longRangePotential += frameData.reciprocalPotential;
      frameData.longRangePotential += frameData.surfacePotential;
      hasLongRangePotential = true;
      hasPotentialEnergy    = false;
      hasTotalEnergy        = false;
    }
    return frameData.longRangePotential;
  }